

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

string * TestSuite::getInfoMsg_abi_cxx11_(void)

{
  long *in_FS_OFFSET;
  
  if (*(char *)(*in_FS_OFFSET + -0x60) == '\0') {
    getInfoMsg_abi_cxx11_();
  }
  return (string *)(*in_FS_OFFSET + -0x80);
}

Assistant:

static std::string& getInfoMsg() {
        thread_local std::string info_msg;
        return info_msg;
    }